

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O2

void highbd_bilinear_filter4xh
               (uint16_t *src,int src_stride,int xoffset,int yoffset,uint16_t *dst,int h)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar18 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar19 [16];
  
  auVar22 = _DAT_0046f110;
  if (xoffset == 0) {
    for (lVar5 = 0; (int)lVar5 <= h; lVar5 = lVar5 + 1) {
      *(undefined8 *)(dst + lVar5 * 4) = *(undefined8 *)src;
      src = src + src_stride;
    }
  }
  else if (xoffset == 4) {
    for (lVar5 = 0; (int)lVar5 <= h; lVar5 = lVar5 + 1) {
      uVar7 = pavgw(src[1],*src);
      uVar8 = pavgw(src[2],src[1]);
      uVar9 = pavgw(src[3],src[2]);
      uVar10 = pavgw(src[4],src[3]);
      pavgw(src[5],src[4]);
      pavgw(src[6],src[5]);
      pavgw(src[7],src[6]);
      pavgw(0,src[7]);
      *(ulong *)(dst + lVar5 * 4) = CONCAT26(uVar10,CONCAT24(uVar9,CONCAT22(uVar8,uVar7)));
      src = src + src_stride;
    }
  }
  else {
    uVar3 = (uint)bilinear_filters_2t[xoffset][1] << 0x10 | (uint)bilinear_filters_2t[xoffset][0];
    auVar15._4_4_ = uVar3;
    auVar15._0_4_ = uVar3;
    auVar15._8_4_ = uVar3;
    auVar15._12_4_ = uVar3;
    lVar5 = 0;
    while( true ) {
      auVar20 = *(undefined1 (*) [16])src;
      auVar29._0_12_ = auVar20._0_12_;
      auVar29._12_2_ = auVar20._6_2_;
      auVar29._14_2_ = auVar20._8_2_;
      auVar19._12_4_ = auVar29._12_4_;
      auVar19._0_10_ = auVar20._0_10_;
      auVar19._10_2_ = auVar20._6_2_;
      auVar18._10_6_ = auVar19._10_6_;
      auVar18._0_8_ = auVar20._0_8_;
      auVar18._8_2_ = auVar20._4_2_;
      auVar17._8_8_ = auVar18._8_8_;
      auVar17._6_2_ = auVar20._4_2_;
      auVar17._4_2_ = auVar20._2_2_;
      auVar17._0_4_ = auVar20._0_4_;
      auVar20._4_12_ = auVar17._4_12_;
      if (h <= (int)lVar5) break;
      auVar29 = pshufb(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + (long)src_stride * 2),
                       auVar22);
      auVar20 = pmaddwd(auVar20,auVar15);
      auVar21._0_4_ = auVar20._0_4_ + 0x40U >> 7;
      auVar21._4_4_ = auVar20._4_4_ + 0x40U >> 7;
      auVar21._8_4_ = auVar20._8_4_ + 0x40U >> 7;
      auVar21._12_4_ = auVar20._12_4_ + 0x40U >> 7;
      auVar20 = pmaddwd(auVar29,auVar15);
      auVar30._0_4_ = auVar20._0_4_ + 0x40U >> 7;
      auVar30._4_4_ = auVar20._4_4_ + 0x40U >> 7;
      auVar30._8_4_ = auVar20._8_4_ + 0x40U >> 7;
      auVar30._12_4_ = auVar20._12_4_ + 0x40U >> 7;
      auVar20 = packssdw(auVar21,auVar30);
      *(undefined1 (*) [16])(dst + lVar5 * 4) = auVar20;
      lVar5 = lVar5 + 2;
      src = (uint16_t *)(*(undefined1 (*) [16])src + (long)(src_stride * 2) * 2);
    }
    auVar22 = pmaddwd(auVar20,auVar15);
    auVar23._0_4_ = auVar22._0_4_ + 0x40U >> 7;
    auVar23._4_4_ = auVar22._4_4_ + 0x40U >> 7;
    auVar23._8_4_ = auVar22._8_4_ + 0x40U >> 7;
    auVar23._12_4_ = auVar22._12_4_ + 0x40U >> 7;
    auVar22 = packssdw(auVar23,auVar23);
    *(long *)(dst + lVar5 * 4) = auVar22._0_8_;
  }
  if (yoffset != 0) {
    if (yoffset == 4) {
      uVar4 = 0;
      uVar6 = (ulong)(uint)h;
      if (h < 1) {
        uVar6 = uVar4;
      }
      for (; (int)uVar6 != (int)uVar4; uVar4 = uVar4 + 1) {
        uVar1 = *(undefined8 *)(dst + uVar4 * 4);
        uVar2 = *(undefined8 *)(dst + uVar4 * 4 + 4);
        uVar7 = pavgw((short)uVar2,(short)uVar1);
        uVar8 = pavgw((short)((ulong)uVar2 >> 0x10),(short)((ulong)uVar1 >> 0x10));
        uVar9 = pavgw((short)((ulong)uVar2 >> 0x20),(short)((ulong)uVar1 >> 0x20));
        uVar10 = pavgw((short)((ulong)uVar2 >> 0x30),(short)((ulong)uVar1 >> 0x30));
        pavgw(0,0);
        pavgw(0,0);
        pavgw(0,0);
        pavgw(0,0);
        *(ulong *)(dst + uVar4 * 4) = CONCAT26(uVar10,CONCAT24(uVar9,CONCAT22(uVar8,uVar7)));
      }
    }
    else {
      uVar3 = (uint)bilinear_filters_2t[yoffset][1] << 0x10 | (uint)bilinear_filters_2t[yoffset][0];
      auVar22._4_4_ = uVar3;
      auVar22._0_4_ = uVar3;
      auVar22._8_4_ = uVar3;
      auVar22._12_4_ = uVar3;
      for (lVar5 = 0; (int)lVar5 < h; lVar5 = lVar5 + 2) {
        uVar6 = *(ulong *)(dst + lVar5 * 4);
        uVar4 = *(ulong *)(dst + lVar5 * 4 + 4);
        uVar1 = *(undefined8 *)(dst + lVar5 * 4 + 8);
        uVar9 = (undefined2)(uVar4 >> 0x30);
        auVar14._8_4_ = 0;
        auVar14._0_8_ = uVar6;
        auVar14._12_2_ = (short)(uVar6 >> 0x30);
        auVar14._14_2_ = uVar9;
        auVar13._12_4_ = auVar14._12_4_;
        auVar13._8_2_ = 0;
        auVar13._0_8_ = uVar6;
        uVar8 = (undefined2)(uVar4 >> 0x20);
        auVar13._10_2_ = uVar8;
        auVar12._10_6_ = auVar13._10_6_;
        auVar12._8_2_ = (short)(uVar6 >> 0x20);
        auVar12._0_8_ = uVar6;
        auVar11._8_8_ = auVar12._8_8_;
        uVar7 = (undefined2)(uVar4 >> 0x10);
        auVar11._6_2_ = uVar7;
        auVar11._4_2_ = (short)(uVar6 >> 0x10);
        auVar11._0_2_ = (undefined2)uVar6;
        auVar24._0_2_ = (undefined2)uVar4;
        auVar11._2_2_ = auVar24._0_2_;
        auVar15 = pmaddwd(auVar11,auVar22);
        auVar16._0_4_ = auVar15._0_4_ + 0x40U >> 7;
        auVar16._4_4_ = auVar15._4_4_ + 0x40U >> 7;
        auVar16._8_4_ = auVar15._8_4_ + 0x40U >> 7;
        auVar16._12_4_ = auVar15._12_4_ + 0x40U >> 7;
        auVar27._8_4_ = 0;
        auVar27._0_8_ = uVar4;
        auVar27._12_2_ = uVar9;
        auVar27._14_2_ = (short)((ulong)uVar1 >> 0x30);
        auVar26._12_4_ = auVar27._12_4_;
        auVar26._8_2_ = 0;
        auVar26._0_8_ = uVar4;
        auVar26._10_2_ = (short)((ulong)uVar1 >> 0x20);
        auVar25._10_6_ = auVar26._10_6_;
        auVar25._8_2_ = uVar8;
        auVar25._0_8_ = uVar4;
        auVar24._8_8_ = auVar25._8_8_;
        auVar24._6_2_ = (short)((ulong)uVar1 >> 0x10);
        auVar24._4_2_ = uVar7;
        auVar24._2_2_ = (short)uVar1;
        auVar15 = pmaddwd(auVar24,auVar22);
        auVar28._0_4_ = auVar15._0_4_ + 0x40U >> 7;
        auVar28._4_4_ = auVar15._4_4_ + 0x40U >> 7;
        auVar28._8_4_ = auVar15._8_4_ + 0x40U >> 7;
        auVar28._12_4_ = auVar15._12_4_ + 0x40U >> 7;
        auVar15 = packssdw(auVar16,auVar28);
        *(undefined1 (*) [16])(dst + lVar5 * 4) = auVar15;
      }
    }
  }
  return;
}

Assistant:

static void highbd_bilinear_filter4xh(const uint16_t *src, int src_stride,
                                      int xoffset, int yoffset, uint16_t *dst,
                                      int h) {
  int i;
  // Horizontal filter
  if (xoffset == 0) {
    uint16_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      __m128i x = _mm_loadl_epi64((__m128i *)src);
      _mm_storel_epi64((__m128i *)b, x);
      src += src_stride;
      b += 4;
    }
  } else if (xoffset == 4) {
    uint16_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      __m128i x = _mm_loadu_si128((__m128i *)src);
      __m128i z = _mm_srli_si128(x, 2);
      _mm_storel_epi64((__m128i *)b, _mm_avg_epu16(x, z));
      src += src_stride;
      b += 4;
    }
  } else {
    uint16_t *b = dst;
    const uint8_t *hfilter = bilinear_filters_2t[xoffset];
    const __m128i hfilter_vec = _mm_set1_epi32(hfilter[0] | (hfilter[1] << 16));
    for (i = 0; i < h; i += 2) {
      const __m128i x0 = _mm_loadu_si128((__m128i *)src);
      const __m128i z0 = _mm_srli_si128(x0, 2);
      const __m128i x1 = _mm_loadu_si128((__m128i *)&src[src_stride]);
      const __m128i z1 = _mm_srli_si128(x1, 2);
      const __m128i res =
          highbd_filter_block_2rows(&x0, &z0, &x1, &z1, &hfilter_vec);
      _mm_storeu_si128((__m128i *)b, res);

      src += src_stride * 2;
      b += 8;
    }
    // Process i = h separately
    __m128i x = _mm_loadu_si128((__m128i *)src);
    __m128i z = _mm_srli_si128(x, 2);

    __m128i v0 = _mm_unpacklo_epi16(x, z);
    v0 = _mm_madd_epi16(v0, hfilter_vec);
    v0 = xx_roundn_epu32(v0, FILTER_BITS);

    _mm_storel_epi64((__m128i *)b, _mm_packs_epi32(v0, v0));
  }

  // Vertical filter
  if (yoffset == 0) {
    // The data is already in 'dst', so no need to filter
  } else if (yoffset == 4) {
    for (i = 0; i < h; ++i) {
      __m128i x = _mm_loadl_epi64((__m128i *)dst);
      __m128i y = _mm_loadl_epi64((__m128i *)&dst[4]);
      _mm_storel_epi64((__m128i *)dst, _mm_avg_epu16(x, y));
      dst += 4;
    }
  } else {
    const uint8_t *vfilter = bilinear_filters_2t[yoffset];
    const __m128i vfilter_vec = _mm_set1_epi32(vfilter[0] | (vfilter[1] << 16));
    for (i = 0; i < h; i += 2) {
      const __m128i x = _mm_loadl_epi64((__m128i *)dst);
      const __m128i y = _mm_loadl_epi64((__m128i *)&dst[4]);
      const __m128i z = _mm_loadl_epi64((__m128i *)&dst[8]);
      const __m128i res =
          highbd_filter_block_2rows(&x, &y, &y, &z, &vfilter_vec);
      _mm_storeu_si128((__m128i *)dst, res);

      dst += 8;
    }
  }
}